

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

lysp_tpdf * lysp_typedef_match(char *name,lysp_tpdf *typedefs)

{
  lysp_tpdf *plVar1;
  int iVar2;
  ulong uVar3;
  lysp_tpdf *plVar4;
  ulong uVar5;
  
  plVar4 = typedefs + -1;
  uVar5 = 0xffffffffffffffff;
  while( true ) {
    if (typedefs == (lysp_tpdf *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ulong *)&typedefs[-1].flags;
    }
    uVar5 = uVar5 + 1;
    if (uVar3 <= uVar5) break;
    plVar1 = plVar4 + 1;
    plVar4 = plVar4 + 1;
    iVar2 = strcmp(name,plVar1->name);
    if (iVar2 == 0) {
      return plVar4;
    }
  }
  return (lysp_tpdf *)0x0;
}

Assistant:

static const struct lysp_tpdf *
lysp_typedef_match(const char *name, const struct lysp_tpdf *typedefs)
{
    LY_ARRAY_COUNT_TYPE u;

    LY_ARRAY_FOR(typedefs, u) {
        if (!strcmp(name, typedefs[u].name)) {
            /* match */
            return &typedefs[u];
        }
    }
    return NULL;
}